

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp_world.cpp
# Opt level: O2

State * __thiscall despot::POMDPWorld::Initialize(POMDPWorld *this)

{
  DSPOMDP *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_39;
  string local_38 [32];
  
  pDVar1 = this->model_;
  std::__cxx11::string::string<std::allocator<char>>(local_38,"DEFAULT",&local_39);
  iVar2 = (*pDVar1->_vptr_DSPOMDP[8])(pDVar1,local_38);
  (this->super_World).state_ = (State *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string(local_38);
  return (this->super_World).state_;
}

Assistant:

State* POMDPWorld::Initialize() {
	state_ = model_->CreateStartState();
	return state_;
}